

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O3

void __thiscall RoleMaskProxyModel::setMergeDisplayEdit(RoleMaskProxyModel *this,bool val)

{
  QSet<int> *this_00;
  byte bVar1;
  RoleMaskProxyModelPrivate *this_01;
  Span *pSVar2;
  long lVar3;
  Data<QHashPrivate::Node<int,_QHashDummyValue>_> *this_02;
  ulong uVar4;
  Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_> *d_00;
  Node<int,_QHashDummyValue> *pNVar5;
  iterator iVar6;
  iterator iVar7;
  ulong uVar8;
  long *plVar9;
  QArrayData *d;
  QHashDummyValue local_71;
  QArrayData *local_70;
  QVector<int> local_68;
  RoleMaskProxyModel *local_50;
  QModelIndex local_48;
  
  this_01 = this->d_ptr;
  if (this_01->m_mergeDisplayEdit == val) {
    return;
  }
  local_50 = this;
  local_68.d.ptr = (int *)QArrayData::allocate((QArrayData **)&local_48,4,8,2,KeepSize);
  local_70 = (QArrayData *)local_48._0_8_;
  local_68.d.d = (Data *)local_48._0_8_;
  local_68.d.ptr[0] = 0;
  local_68.d.ptr[1] = 2;
  local_68.d.size = 2;
  this_01->m_mergeDisplayEdit = val;
  d_00 = (this_01->m_masked).d;
  if ((d_00 == (Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_> *)0x0) ||
     (1 < (uint)(d_00->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    d_00 = QHashPrivate::Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_>::detached
                     (d_00,0);
    (this_01->m_masked).d = d_00;
  }
  pSVar2 = d_00->spans;
  if (pSVar2->offsets[0] == 0xff) {
    uVar4 = 1;
    do {
      uVar8 = uVar4;
      if (d_00->numBuckets == uVar8) goto LAB_0014b36c;
      uVar4 = uVar8 + 1;
    } while (pSVar2[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
    if (d_00 == (Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_> *)0x0) {
LAB_0014b36c:
      this_00 = &this_01->m_maskedRoles;
      if (val) {
        local_48.r = 2;
        QHash<int,_QHashDummyValue>::remove(&this_00->q_hash,(char *)&local_48);
      }
      else {
        local_48._0_8_ = (ulong)(uint)local_48.c << 0x20;
        this_02 = (this_00->q_hash).d;
        if ((this_02 != (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0) &&
           (pNVar5 = QHashPrivate::Data<QHashPrivate::Node<int,_QHashDummyValue>_>::findNode
                               (this_02,&local_48.r), pNVar5 != (Node<int,_QHashDummyValue> *)0x0))
        {
          local_48.r = 2;
          QHash<int,_QHashDummyValue>::emplace<QHashDummyValue>
                    (&this_00->q_hash,&local_48.r,&local_71);
        }
      }
      if (this_01->m_maskHeaderData == true) {
        iVar6 = QList<QMap<int,_QVariant>_>::begin(&this_01->m_hHeaderData);
        iVar7 = QList<QMap<int,_QVariant>_>::end(&this_01->m_hHeaderData);
        if (iVar6.i != iVar7.i) {
          do {
            setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()
                      ((anon_class_1_1_ba1d8281 *)(ulong)val,iVar6.i);
            iVar6.i = iVar6.i + 1;
          } while (iVar6.i != iVar7.i);
        }
        iVar6 = QList<QMap<int,_QVariant>_>::begin(&this_01->m_vHeaderData);
        iVar7 = QList<QMap<int,_QVariant>_>::end(&this_01->m_vHeaderData);
        for (; iVar6.i != iVar7.i; iVar6.i = iVar6.i + 1) {
          setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()
                    ((anon_class_1_1_ba1d8281 *)(ulong)val,iVar6.i);
        }
      }
      mergeDisplayEditChanged(local_50,this_01->m_mergeDisplayEdit);
      local_48._0_8_ = (QArrayData *)0xffffffffffffffff;
      local_48.i = 0;
      local_48.m = (QAbstractItemModel *)0x0;
      RoleMaskProxyModelPrivate::signalAllChanged(this_01,&local_68,&local_48);
      if (&(local_68.d.d)->super_QArrayData == (QArrayData *)0x0) {
        return;
      }
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0) {
        return;
      }
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,8);
      return;
    }
  }
  else {
    uVar8 = 0;
  }
  plVar9 = (long *)((long)&pSVar2[uVar8 >> 7].entries
                           [pSVar2[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f]].storage + 8);
  do {
    do {
      setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()
                ((anon_class_1_1_ba1d8281 *)(ulong)val,(RolesContainer *)*plVar9);
      lVar3 = *plVar9;
      plVar9 = (long *)(lVar3 + 0x18);
    } while (*(long *)(lVar3 + 0x18) != 0);
    do {
      if (d_00->numBuckets - 1 == uVar8) goto LAB_0014b36c;
      uVar8 = uVar8 + 1;
      bVar1 = d_00->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f];
    } while (bVar1 == 0xff);
    plVar9 = (long *)((long)&d_00->spans[uVar8 >> 7].entries[bVar1].storage + 8);
  } while( true );
}

Assistant:

void RoleMaskProxyModel::setMergeDisplayEdit(bool val)
{
    const auto setMergeDisplayEditContainer = [val](RolesContainer &container) {
        if (val) {
            if (container.contains(Qt::DisplayRole)) {
                container.remove(Qt::EditRole);
            } else {
                const auto roleIter = container.constFind(Qt::EditRole);
                if (roleIter != container.constEnd()) {
                    container.insert(Qt::DisplayRole, *roleIter);
                    container.remove(Qt::EditRole);
                }
            }
        } else {
            const auto roleIter = container.constFind(Qt::DisplayRole);
            if (roleIter != container.constEnd()) {
                container.insert(Qt::EditRole, *roleIter);
            }
        }
    };
    Q_D(RoleMaskProxyModel);
    if (d->m_mergeDisplayEdit != val) {
        QVector<int> changedRoles({Qt::DisplayRole, Qt::EditRole});
        d->m_mergeDisplayEdit = val;
        for (auto idxIter = d->m_masked.begin(), idxEnd = d->m_masked.end(); idxIter != idxEnd; ++idxIter)
            setMergeDisplayEditContainer(idxIter->m_data.roles);
        if (val)
            d->m_maskedRoles.remove(Qt::EditRole);
        else if (d->m_maskedRoles.contains(Qt::DisplayRole))
            d->m_maskedRoles.insert(Qt::EditRole);
        if (d->m_maskHeaderData) {
            for (auto idxIter = d->m_hHeaderData.begin(), idxEnd = d->m_hHeaderData.end(); idxIter != idxEnd; ++idxIter)
                setMergeDisplayEditContainer(*idxIter);
            for (auto idxIter = d->m_vHeaderData.begin(), idxEnd = d->m_vHeaderData.end(); idxIter != idxEnd; ++idxIter)
                setMergeDisplayEditContainer(*idxIter);
        }
        mergeDisplayEditChanged(d->m_mergeDisplayEdit);
        d->signalAllChanged(changedRoles);
    }
}